

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O0

bool helics::CoreFactory::registerCore(shared_ptr<helics::Core> *core,CoreType type)

{
  bool bVar1;
  element_type *peVar2;
  __shared_ptr *in_RDI;
  CoreType in_stack_0000002c;
  shared_ptr<helics::Core> *in_stack_00000030;
  string *in_stack_00000038;
  SearchableObjectHolder<helics::Core,_helics::CoreType> *in_stack_00000040;
  string *cname;
  bool res;
  undefined4 in_stack_ffffffffffffff68;
  CoreType in_stack_ffffffffffffff6c;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  shared_ptr<helics::Core> *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  shared_ptr<helics::Core> local_48;
  undefined1 local_38 [32];
  undefined1 *local_18;
  byte local_d;
  __shared_ptr *local_8;
  
  local_d = 0;
  local_8 = in_RDI;
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RDI);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x5123fe);
    (*peVar2->_vptr_Core[0xc])();
    std::__cxx11::string::string(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  else {
    std::__cxx11::string::string(in_stack_ffffffffffffff80);
  }
  local_18 = local_38;
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_8);
  if (bVar1) {
    in_stack_ffffffffffffff88 = &local_48;
    std::shared_ptr<helics::Core>::shared_ptr
              ((shared_ptr<helics::Core> *)
               CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
               (shared_ptr<helics::Core> *)
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    in_stack_ffffffffffffff97 =
         gmlc::concurrency::SearchableObjectHolder<helics::Core,_helics::CoreType>::addObject
                   (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_0000002c);
    local_d = in_stack_ffffffffffffff97;
    std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x51249e);
  }
  if ((local_d & 1) != 0) {
    std::shared_ptr<helics::Core>::shared_ptr
              ((shared_ptr<helics::Core> *)
               CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
               (shared_ptr<helics::Core> *)
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    gmlc::concurrency::DelayedDestructor<helics::Core>::addObjectsToBeDestroyed
              ((DelayedDestructor<helics::Core> *)
               CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
    std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x5124fb);
    addExtraTypes((string *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                  in_stack_ffffffffffffff6c);
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(local_d,in_stack_ffffffffffffff70));
  return (bool)(local_d & 1);
}

Assistant:

bool registerCore(const std::shared_ptr<Core>& core, CoreType type)
{
    bool res = false;
    const std::string& cname = (core) ? core->getIdentifier() : std::string{};
    if (core) {
        res = searchableCores.addObject(cname, core, type);
    }
    if (res) {
        delayedDestroyer.addObjectsToBeDestroyed(core);
        addExtraTypes(cname, type);
    }
    return res;
}